

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_aes_gcm.c
# Opt level: O0

void * aes_gcm_newctx(void *provctx,size_t keybits)

{
  int iVar1;
  void *keybits_00;
  PROV_GCM_CTX *in_RSI;
  PROV_GCM_HW *in_RDI;
  PROV_AES_GCM_CTX *ctx;
  undefined8 in_stack_ffffffffffffffd0;
  int line;
  char *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    local_8 = (void *)0x0;
  }
  else {
    keybits_00 = CRYPTO_zalloc(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,line);
    local_8 = keybits_00;
    if (keybits_00 != (void *)0x0) {
      ossl_prov_aes_hw_gcm((size_t)in_RSI);
      ossl_gcm_initctx(local_8,in_RSI,(size_t)keybits_00,in_RDI);
    }
  }
  return local_8;
}

Assistant:

static void *aes_gcm_newctx(void *provctx, size_t keybits)
{
    PROV_AES_GCM_CTX *ctx;

    if (!ossl_prov_is_running())
        return NULL;

    ctx = OPENSSL_zalloc(sizeof(*ctx));
    if (ctx != NULL)
        ossl_gcm_initctx(provctx, &ctx->base, keybits,
                         ossl_prov_aes_hw_gcm(keybits));
    return ctx;
}